

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::StaticInit::StaticInit(StaticInit *this)

{
  format_string_t<const_ghc::filesystem::path_&> fmt;
  format_string_t<const_ghc::filesystem::path_&> fmt_00;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Texture *this_00;
  DebugScreen *in_RDI;
  path *filenameNoGrid;
  uint in_stack_00000104;
  Texture *in_stack_00000108;
  path *in_stack_00000110;
  path *filenameGrid;
  ResourceBase *resource;
  path *in_stack_fffffffffffffeb0;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec0;
  format in_stack_fffffffffffffec4;
  undefined4 uVar5;
  Texture *in_stack_fffffffffffffec8;
  path *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [32];
  basic_string_view<char> local_d8;
  allocator local_c1;
  string local_c0 [32];
  basic_string_view<char> local_a0 [2];
  undefined1 local_80 [32];
  undefined1 *local_60;
  undefined1 local_58 [32];
  undefined1 *local_38;
  ResourceBase *local_30;
  char *local_20;
  basic_string_view<char> *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  string *name;
  undefined4 extraout_var_00;
  
  spdlog::debug<char[32]>((char (*) [32])0x15f7c8);
  local_30 = Locator::getResource();
  ghc::filesystem::path::path<char[30],ghc::filesystem::path>
            (in_stack_fffffffffffffed0,(char (*) [30])in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec4);
  local_38 = local_58;
  ghc::filesystem::path::path<char[32],ghc::filesystem::path>
            (in_stack_fffffffffffffed0,(char (*) [32])in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec4);
  local_60 = local_80;
  iVar3 = (*local_30->_vptr_ResourceBase[2])(local_30,local_38,1);
  name = (string *)CONCAT44(extraout_var,iVar3);
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)name;
  anon_unknown.dwarf_86167::loadTileset(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  sf::Texture::setSmooth
            ((Texture *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (bool)in_stack_fffffffffffffebf);
  uVar1 = sf::Texture::generateMipmap(in_stack_fffffffffffffec8);
  if (!(bool)uVar1) {
    local_18 = local_a0;
    local_20 = "\"{}\": Unable to generate mipmap for texture.";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_18,"\"{}\": Unable to generate mipmap for texture.",0x2c);
    fmt.str.data_._7_1_ = in_stack_fffffffffffffebf;
    fmt.str.data_._0_7_ = in_stack_fffffffffffffeb8;
    fmt.str.size_._0_4_ = in_stack_fffffffffffffec0;
    fmt.str.size_._4_4_ = in_stack_fffffffffffffec4;
    spdlog::warn<ghc::filesystem::path_const&>(fmt,in_stack_fffffffffffffeb0);
  }
  DebugScreen::instance();
  paVar4 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"tilesetGrid",paVar4);
  DebugScreen::registerTexture(in_RDI,name,(Texture *)CONCAT17(uVar1,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  iVar3 = (*local_30->_vptr_ResourceBase[2])(local_30,local_60,1);
  this_00 = (Texture *)CONCAT44(extraout_var_00,iVar3);
  *(Texture **)&in_RDI->mode_ = this_00;
  anon_unknown.dwarf_86167::loadTileset(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  sf::Texture::setSmooth
            ((Texture *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (bool)in_stack_fffffffffffffebf);
  bVar2 = sf::Texture::generateMipmap(this_00);
  uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffec4);
  if (!bVar2) {
    local_8 = &local_d8;
    local_10 = "\"{}\": Unable to generate mipmap for texture.";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_8,"\"{}\": Unable to generate mipmap for texture.",0x2c);
    fmt_00.str.data_._7_1_ = in_stack_fffffffffffffebf;
    fmt_00.str.data_._0_7_ = in_stack_fffffffffffffeb8;
    fmt_00.str.size_._0_4_ = in_stack_fffffffffffffec0;
    fmt_00.str.size_._4_4_ = uVar5;
    spdlog::warn<ghc::filesystem::path_const&>(fmt_00,in_stack_fffffffffffffeb0);
  }
  DebugScreen::instance();
  paVar4 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"tilesetNoGrid",paVar4);
  DebugScreen::registerTexture(in_RDI,name,(Texture *)CONCAT17(uVar1,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  ghc::filesystem::path::~path((path *)0x15fb3a);
  ghc::filesystem::path::~path((path *)0x15fb47);
  return;
}

Assistant:

Board::StaticInit::StaticInit() {
    spdlog::debug("Board::StaticInit initializing.");
    ResourceBase* resource = Locator::getResource();
    const fs::path& filenameGrid = "resources/texturePackGrid.png";
    const fs::path& filenameNoGrid = "resources/texturePackNoGrid.png";

    tilesetGrid = &resource->getTexture(filenameGrid, true);
    loadTileset(filenameGrid, tilesetGrid, TileWidth::TEXELS);
    tilesetGrid->setSmooth(true);
    if (!tilesetGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetGrid", tilesetGrid);

    tilesetNoGrid = &resource->getTexture(filenameNoGrid, true);
    loadTileset(filenameNoGrid, tilesetNoGrid, TileWidth::TEXELS);
    tilesetNoGrid->setSmooth(true);
    if (!tilesetNoGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameNoGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetNoGrid", tilesetNoGrid);
}